

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FieldDescriptor::GetLocationPath
          (FieldDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  LogLevel LVar1;
  LogMessage *other;
  ulong uVar2;
  long lVar3;
  int *__args;
  iterator iVar4;
  LogLevel local_5c;
  LogLevel local_58 [14];
  
  if (((byte)this[1] & 8) == 0) {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x20),output);
    local_58[0] = LOGLEVEL_ERROR;
    iVar4._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current !=
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      *iVar4._M_current = 2;
      goto LAB_0035552b;
    }
LAB_00355535:
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,(int *)local_58);
  }
  else {
    if (*(long *)(this + 0x28) != 0) {
      if (((byte)this[1] & 8) == 0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.h"
                   ,0x8d0);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_58,"CHECK failed: is_extension_: ");
        internal::LogFinisher::operator=((LogFinisher *)&local_5c,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_58);
      }
      Descriptor::GetLocationPath(*(Descriptor **)(this + 0x28),output);
      local_5c = 6;
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar4._M_current ==
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (output,iVar4,(int *)&local_5c);
      }
      else {
        *iVar4._M_current = 6;
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar4._M_current + 1;
      }
      lVar3 = 0x10;
      if (*(long *)(this + 0x28) != 0) {
        lVar3 = 0x28;
      }
      uVar2 = (ulong)(*(long *)(this + 0x28) == 0) << 5 | 0x50;
      if (((byte)this[1] & 8) == 0) {
        uVar2 = 0x28;
        lVar3 = 0x20;
      }
      LVar1 = (int)((ulong)((long)this - *(long *)(*(long *)(this + lVar3) + uVar2)) >> 3) *
              0x38e38e39;
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar4._M_current !=
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) goto LAB_003555fa;
      __args = (int *)&local_5c;
      local_5c = LVar1;
      goto LAB_0035560b;
    }
    local_58[0] = 7;
    iVar4._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_00355535;
    *iVar4._M_current = 7;
LAB_0035552b:
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  lVar3 = 0x10;
  if (*(long *)(this + 0x28) != 0) {
    lVar3 = 0x28;
  }
  uVar2 = (ulong)(*(long *)(this + 0x28) == 0) << 5 | 0x50;
  if (((byte)this[1] & 8) == 0) {
    uVar2 = 0x28;
    lVar3 = 0x20;
  }
  LVar1 = (int)((ulong)((long)this - *(long *)(*(long *)(this + lVar3) + uVar2)) >> 3) * 0x38e38e39;
  iVar4._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar4._M_current !=
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
LAB_003555fa:
    *iVar4._M_current = LVar1;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((LogLevel *)iVar4._M_current + 1);
    return;
  }
  __args = (int *)local_58;
  local_58[0] = LVar1;
LAB_0035560b:
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,__args);
  return;
}

Assistant:

void FieldDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (is_extension()) {
    if (extension_scope() == nullptr) {
      output->push_back(FileDescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    } else {
      extension_scope()->GetLocationPath(output);
      output->push_back(DescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    }
  } else {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kFieldFieldNumber);
    output->push_back(index());
  }
}